

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

uint64_t __thiscall
jessilib::text_hash::operator()
          (text_hash *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_key
          )

{
  char *in_RDX;
  ulong uVar1;
  pointer pcVar2;
  pointer pcVar3;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  decode_result dVar4;
  
  uVar1 = 0xcbf29ce484222325;
  if (in_key->_M_string_length != 0) {
    pcVar2 = (in_key->_M_dataplus)._M_p;
    pcVar3 = pcVar2 + in_key->_M_string_length;
    do {
      in_string._M_str = in_RDX;
      in_string._M_len = (size_t)pcVar2;
      dVar4 = decode_codepoint_utf8<char>((jessilib *)(pcVar3 + -(long)pcVar2),in_string);
      in_RDX = (char *)dVar4.units;
      if (in_RDX == (char *)0x0) {
        return uVar1;
      }
      uVar1 = (uVar1 ^ (uint)dVar4.codepoint) * 0x100000001b3;
      pcVar2 = pcVar2 + (long)in_RDX;
    } while (pcVar2 != pcVar3);
  }
  return uVar1;
}

Assistant:

auto operator()(const std::basic_string<char>& in_key) const noexcept { // ASSUMES UTF-8
		return hash(in_key.data(), in_key.data() + in_key.size());
	}